

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O2

Symbol * slang::ast::createCheckerFormal
                   (Compilation *comp,AssertionPortSymbol *port,CheckerInstanceBodySymbol *instance,
                   ExpressionSyntax **outputInitialSyntax,ASTContext *context)

{
  SyntaxNode *pSVar1;
  int iVar2;
  FormalArgumentSymbol *this;
  ExpressionSyntax *pEVar3;
  undefined4 extraout_var;
  ExpressionSyntax **ppEVar4;
  CheckerInstanceBodySymbol *extraout_RDX;
  CheckerInstanceBodySymbol *__child_stack;
  ASTContext *__arg;
  VariableLifetime local_2c;
  
  pSVar1 = (port->super_Symbol).originatingSyntax;
  ppEVar4 = outputInitialSyntax;
  __child_stack = instance;
  __arg = context;
  if ((pSVar1 != (SyntaxNode *)0x0) && (pSVar1 = pSVar1->previewNode, pSVar1 != (SyntaxNode *)0x0))
  {
    Scope::addMembers(&instance->super_Scope,pSVar1);
    __child_stack = extraout_RDX;
  }
  if (((port->direction).super__Optional_base<slang::ast::ArgumentDirection,_true,_true>._M_payload.
       super__Optional_payload_base<slang::ast::ArgumentDirection>._M_engaged == true) &&
     ((port->direction).super__Optional_base<slang::ast::ArgumentDirection,_true,_true>._M_payload.
      super__Optional_payload_base<slang::ast::ArgumentDirection>._M_payload._M_value == Out)) {
    local_2c = Static;
    this = BumpAllocator::
           emplace<slang::ast::FormalArgumentSymbol,std::basic_string_view<char,std::char_traits<char>>const&,slang::SourceLocation_const&,slang::ast::ArgumentDirection_const&,slang::ast::VariableLifetime>
                     (&comp->super_BumpAllocator,&(port->super_Symbol).name,
                      &(port->super_Symbol).location,(ArgumentDirection *)&port->direction,&local_2c
                     );
    DeclaredType::setLink
              (&(this->super_VariableSymbol).super_ValueSymbol.declaredType,&port->declaredType);
    pSVar1 = (port->super_Symbol).originatingSyntax;
    if (pSVar1 != (SyntaxNode *)0x0) {
      (this->super_VariableSymbol).super_ValueSymbol.super_Symbol.originatingSyntax = pSVar1;
      Symbol::setAttributes
                ((Symbol *)this,&instance->super_Scope,
                 *(span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
                   *)&pSVar1[2].previewNode);
    }
    if (port->defaultValueSyntax != (PropertyExprSyntax *)0x0) {
      pEVar3 = ASTContext::requireSimpleExpr(context,port->defaultValueSyntax);
      *outputInitialSyntax = pEVar3;
    }
  }
  else {
    iVar2 = AssertionPortSymbol::clone
                      (port,(__fn *)&instance->super_Scope,__child_stack,(int)ppEVar4,__arg);
    this = (FormalArgumentSymbol *)CONCAT44(extraout_var,iVar2);
  }
  Scope::addMember(&instance->super_Scope,(Symbol *)this);
  return (Symbol *)this;
}

Assistant:

static const Symbol* createCheckerFormal(Compilation& comp, const AssertionPortSymbol& port,
                                         CheckerInstanceBodySymbol& instance,
                                         const ExpressionSyntax*& outputInitialSyntax,
                                         const ASTContext& context) {
    if (auto portSyntax = port.getSyntax(); portSyntax && portSyntax->previewNode)
        instance.addMembers(*portSyntax->previewNode);

    // Output ports are special; they aren't involved in the rewriting process,
    // they just act like normal formal ports / arguments.
    if (port.direction == ArgumentDirection::Out) {
        auto arg = comp.emplace<FormalArgumentSymbol>(port.name, port.location, *port.direction,
                                                      VariableLifetime::Static);
        arg->getDeclaredType()->setLink(port.declaredType);

        if (auto portSyntax = port.getSyntax()) {
            arg->setSyntax(*portSyntax);
            arg->setAttributes(instance, portSyntax->as<AssertionItemPortSyntax>().attributes);
        }

        if (port.defaultValueSyntax)
            outputInitialSyntax = context.requireSimpleExpr(*port.defaultValueSyntax);

        instance.addMember(*arg);
        return arg;
    }
    else {
        // Clone all of the formal arguments and add them to the instance so that
        // members in the body can reference them.
        auto& cloned = port.clone(instance);
        instance.addMember(cloned);
        return &cloned;
    }
}